

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssa_rewrite_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::SSARewriter::FinalizePhiCandidate(SSARewriter *this,PhiCandidate *phi_candidate)

{
  MemPass *this_00;
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar4;
  size_type sVar5;
  CFG *pCVar6;
  BasicBlock *pBVar7;
  reference puVar8;
  reference pvVar9;
  uint32_t local_6c;
  uint32_t *arg_id;
  BasicBlock *pred_bb;
  const_iterator cStack_38;
  uint32_t pred;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  PhiCandidate *pPStack_18;
  uint32_t ix;
  PhiCandidate *phi_candidate_local;
  SSARewriter *this_local;
  
  pPStack_18 = phi_candidate;
  phi_candidate_local = (PhiCandidate *)this;
  pvVar4 = PhiCandidate::phi_args(phi_candidate);
  sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar4);
  if (sVar5 == 0) {
    __assert_fail("phi_candidate->phi_args().size() > 0 && \"Phi candidate should have arguments\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/ssa_rewrite_pass.cpp"
                  ,0x25f,"void spvtools::opt::SSARewriter::FinalizePhiCandidate(PhiCandidate *)");
  }
  __range2._4_4_ = 0;
  pCVar6 = Pass::cfg(&this->pass_->super_Pass);
  pBVar7 = PhiCandidate::bb(pPStack_18);
  uVar2 = BasicBlock::id(pBVar7);
  pvVar4 = CFG::preds(pCVar6,uVar2);
  __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar4);
  cStack_38 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar4);
  while (bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffc8), bVar1) {
    puVar8 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end2);
    uVar2 = *puVar8;
    pCVar6 = Pass::cfg(&this->pass_->super_Pass);
    pBVar7 = CFG::block(pCVar6,uVar2);
    pvVar4 = PhiCandidate::phi_args(pPStack_18);
    pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (pvVar4,(ulong)__range2._4_4_);
    if (*pvVar9 == 0) {
      bVar1 = IsBlockSealed(this,pBVar7);
      if (bVar1) {
        uVar2 = PhiCandidate::var_id(pPStack_18);
        local_6c = GetReachingDef(this,uVar2,pBVar7);
      }
      else {
        this_00 = this->pass_;
        uVar2 = PhiCandidate::var_id(pPStack_18);
        local_6c = MemPass::GetUndefVal(this_00,uVar2);
      }
      *pvVar9 = local_6c;
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end2);
    __range2._4_4_ = __range2._4_4_ + 1;
  }
  PhiCandidate::MarkComplete(pPStack_18);
  uVar2 = TryRemoveTrivialPhi(this,pPStack_18);
  uVar3 = PhiCandidate::result_id(pPStack_18);
  if (uVar2 == uVar3) {
    uVar2 = PhiCandidate::copy_of(pPStack_18);
    if (uVar2 != 0) {
      __assert_fail("!phi_candidate->copy_of() && \"A completed Phi cannot be trivial.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/ssa_rewrite_pass.cpp"
                    ,0x276,"void spvtools::opt::SSARewriter::FinalizePhiCandidate(PhiCandidate *)");
    }
    std::
    vector<spvtools::opt::SSARewriter::PhiCandidate_*,_std::allocator<spvtools::opt::SSARewriter::PhiCandidate_*>_>
    ::push_back(&this->phis_to_generate_,&stack0xffffffffffffffe8);
  }
  return;
}

Assistant:

void SSARewriter::FinalizePhiCandidate(PhiCandidate* phi_candidate) {
  assert(phi_candidate->phi_args().size() > 0 &&
         "Phi candidate should have arguments");

  uint32_t ix = 0;
  for (uint32_t pred : pass_->cfg()->preds(phi_candidate->bb()->id())) {
    BasicBlock* pred_bb = pass_->cfg()->block(pred);
    uint32_t& arg_id = phi_candidate->phi_args()[ix++];
    if (arg_id == 0) {
      // If |pred_bb| is still not sealed, it means it's unreachable. In this
      // case, we just use Undef as an argument.
      arg_id = IsBlockSealed(pred_bb)
                   ? GetReachingDef(phi_candidate->var_id(), pred_bb)
                   : pass_->GetUndefVal(phi_candidate->var_id());
    }
  }

  // This candidate is now completed.
  phi_candidate->MarkComplete();

  // If |phi_candidate| is not trivial, add it to the list of Phis to
  // generate.
  if (TryRemoveTrivialPhi(phi_candidate) == phi_candidate->result_id()) {
    // If we could not remove |phi_candidate|, it means that it is complete
    // and not trivial. Add it to the list of Phis to generate.
    assert(!phi_candidate->copy_of() && "A completed Phi cannot be trivial.");
    phis_to_generate_.push_back(phi_candidate);
  }
}